

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_q2_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  byte bVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  int j;
  size_t sVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  uint8_t *puVar17;
  int j_1;
  long lVar18;
  void *pvVar19;
  ulong uVar20;
  int l;
  long lVar21;
  float *pfVar22;
  float *pfVar23;
  float fVar24;
  float fVar25;
  uint uVar26;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint uVar28;
  float fVar29;
  undefined1 auVar27 [16];
  float fVar30;
  uint uVar31;
  uint uVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  anon_union_4_2_5fd15f10 fp32;
  short sVar37;
  float fVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  uint8_t Lm [16];
  uint8_t Ls [16];
  float sw [16];
  uint8_t Laux [16];
  float weight [16];
  float scales [16];
  float mins [16];
  uint8_t L [256];
  int in_stack_fffffffffffffd20;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248 [16];
  uint8_t local_208 [16];
  float local_1f8 [16];
  float local_1b8 [16];
  float local_178 [16];
  uint8_t local_138 [32];
  undefined1 auStack_118 [32];
  undefined1 auStack_f8 [32];
  undefined1 local_d8 [32];
  undefined1 auStack_b8 [136];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar38;
  undefined6 uVar39;
  
  sVar11 = ggml_row_size(GGML_TYPE_Q2_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q2_K_ref(src,(block_q2_K *)dst,n_per_row * nrow);
  }
  else if (0 < nrow) {
    lVar13 = 0;
    do {
      if (0xff < (int)n_per_row) {
        uVar20 = 0;
        pfVar14 = quant_weights;
        pvVar19 = dst;
        pfVar22 = src;
        do {
          local_248[0xc] = 0.0;
          local_248[0xd] = 0.0;
          local_248[0xe] = 0.0;
          local_248[0xf] = 0.0;
          local_248[8] = 0.0;
          local_248[9] = 0.0;
          local_248[10] = 0.0;
          local_248[0xb] = 0.0;
          local_248[4] = 0.0;
          local_248[5] = 0.0;
          local_248[6] = 0.0;
          local_248[7] = 0.0;
          local_248[0] = 0.0;
          local_248[1] = 0.0;
          local_248[2] = 0.0;
          local_248[3] = 0.0;
          fVar30 = 0.0;
          lVar12 = 0;
          do {
            fVar30 = fVar30 + pfVar22[lVar12] * pfVar22[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x100);
          lVar12 = 0;
          pfVar15 = pfVar22;
          pfVar23 = pfVar14;
          do {
            lVar21 = 0;
            do {
              fVar25 = pfVar23[lVar21];
              fVar24 = pfVar15[lVar21] * pfVar15[lVar21] + fVar30 * 0.00390625;
              if (fVar24 < 0.0) {
                fVar24 = sqrtf(fVar24);
              }
              else {
                fVar24 = SQRT(fVar24);
              }
              local_1f8[lVar21] = fVar25 * fVar24;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x10);
            fVar25 = local_248[lVar12];
            lVar21 = 0;
            do {
              fVar25 = fVar25 + local_1f8[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x10);
            local_248[lVar12] = fVar25;
            fVar25 = make_qkx3_quants(0x10,3,pfVar22 + lVar12 * 0x10,local_1f8,
                                      local_138 + lVar12 * 0x10,local_178 + lVar12,local_208,fVar25,
                                      fVar30 * 0.00390625,in_stack_fffffffffffffd20,SUB81(sVar11,0))
            ;
            local_1b8[lVar12] = fVar25;
            lVar12 = lVar12 + 1;
            pfVar15 = pfVar15 + 0x10;
            pfVar23 = pfVar23 + 0x10;
          } while (lVar12 != 0x10);
          fVar30 = make_qp_quants(0x10,0xf,local_1b8,local_258,local_248);
          fVar25 = make_qp_quants(0x10,0xf,local_178,local_268,local_248);
          uVar31 = (int)fVar30 * 2 ^ 0x80000000;
          uVar35 = (int)fVar25 * 2 ^ 0x80000000;
          uVar26 = -(uint)(-0xf000001 < (int)uVar31);
          uVar28 = -(uint)(-0xf000001 < (int)uVar35);
          fVar24 = (float)(~uVar26 & 0x40000000 | ((uint)fVar30 & 0x7f800000) + 0x7800000 & uVar26)
                   + ABS(fVar30) * 5.192297e+33 * 7.70372e-34;
          fVar29 = (float)(~uVar28 & 0x40000000 | ((uint)fVar25 & 0x7f800000) + 0x7800000 & uVar28)
                   + ABS(fVar25) * 5.192297e+33 * 7.70372e-34;
          auVar27._0_4_ = ((uint)fVar24 & 0xfff) + ((uint)fVar24 >> 0xd & 0x7c00);
          auVar27._4_4_ = ((uint)fVar29 & 0xfff) + ((uint)fVar29 >> 0xd & 0x7c00);
          auVar27._8_8_ = 0;
          auVar32._0_4_ = -(uint)(0x7f000000 < (int)uVar31);
          auVar32._4_4_ = -(uint)(0x7f000000 < (int)uVar35);
          auVar32._8_4_ = -(uint)(0 < (int)(extraout_XMM0_Db * 2 ^ 0x80000000));
          auVar32._12_4_ = -(uint)(0 < (int)(extraout_XMM0_Db_00 * 2 ^ 0x80000000));
          auVar34._0_4_ = (uint)fVar30 >> 0x10;
          auVar34._4_4_ = (uint)fVar25 >> 0x10;
          auVar34._8_4_ = extraout_XMM0_Db >> 0x10;
          auVar34._12_4_ = extraout_XMM0_Db_00 >> 0x10;
          lVar12 = uVar20 * 0x54;
          auVar33 = auVar32 & _DAT_0014e680 | auVar34 & _DAT_0014e660 | ~auVar32 & auVar27;
          auVar27 = pshuflw(auVar34 & _DAT_0014e660,auVar33,0xe8);
          *(int *)((long)dst + lVar12 + 0x50) = auVar27._0_4_;
          auVar27 = _DAT_0014e5d0;
          fVar30 = ggml_table_f32_f16[auVar33._0_4_];
          auVar34 = psllw(local_268,4);
          *(undefined1 (*) [16])((long)dst + lVar12) = auVar34 & _DAT_0014e5d0 | local_258;
          auVar32 = _DAT_0014e780;
          auVar34 = _DAT_0014e770;
          fVar25 = ggml_table_f32_f16[auVar33._4_4_];
          puVar17 = local_138;
          lVar21 = 0;
          pfVar15 = pfVar22;
          do {
            bVar1 = *(byte *)((long)dst + lVar21 + lVar12);
            auVar33._0_4_ = (float)(bVar1 & 0xf) * fVar30;
            if ((auVar33._0_4_ != 0.0) || (NAN(auVar33._0_4_))) {
              fVar24 = (float)(bVar1 >> 4) * fVar25;
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
              lVar18 = 0;
              do {
                pfVar23 = pfVar15 + lVar18;
                auVar40._0_4_ = *pfVar23 + fVar24;
                auVar40._4_4_ = pfVar23[1] + fVar24;
                auVar40._8_4_ = pfVar23[2] + fVar24;
                auVar40._12_4_ = pfVar23[3] + fVar24;
                auVar40 = divps(auVar40,auVar33);
                fVar29 = auVar40._0_4_ + 12582912.0;
                fVar42 = auVar40._4_4_ + 12582912.0;
                auVar36._0_8_ = CONCAT44(fVar42,fVar29) & 0x7fffff007fffff;
                auVar36._8_4_ = (uint)(auVar40._8_4_ + 12582912.0) & 0x7fffff;
                auVar36._12_4_ = (uint)(auVar40._12_4_ + 12582912.0) & 0x7fffff;
                auVar43._0_4_ = -(uint)((int)((uint)fVar29 & 0x7fffff) < (int)DAT_0014e750);
                auVar43._4_4_ = -(uint)((int)((uint)fVar42 & 0x7fffff) < DAT_0014e750._4_4_);
                auVar43._8_4_ = -(uint)((int)auVar36._8_4_ < DAT_0014e750._8_4_);
                auVar43._12_4_ = -(uint)((int)auVar36._12_4_ < DAT_0014e750._12_4_);
                auVar40 = ~auVar43 & _DAT_0014e750 | auVar36 & auVar43;
                auVar41._0_4_ = -(uint)(0x400000 < auVar40._0_4_);
                auVar41._4_4_ = -(uint)(0x400000 < auVar40._4_4_);
                auVar41._8_4_ = -(uint)(0x400000 < auVar40._8_4_);
                auVar41._12_4_ = -(uint)(0x400000 < auVar40._12_4_);
                auVar40 = auVar41 & auVar40 & _DAT_0014e730;
                sVar6 = auVar40._0_2_;
                cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar40[0] - (0xff < sVar6);
                sVar6 = auVar40._2_2_;
                sVar37 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar40[2] - (0xff < sVar6),cVar2)
                ;
                sVar6 = auVar40._4_2_;
                cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar40[4] - (0xff < sVar6);
                sVar6 = auVar40._6_2_;
                uVar38 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar40[6] - (0xff < sVar6),
                                  CONCAT12(cVar3,sVar37));
                sVar6 = auVar40._8_2_;
                cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar40[8] - (0xff < sVar6);
                sVar6 = auVar40._10_2_;
                uVar39 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar40[10] - (0xff < sVar6),
                                  CONCAT14(cVar4,uVar38));
                sVar6 = auVar40._12_2_;
                cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar40[0xc] - (0xff < sVar6);
                sVar8 = auVar40._14_2_;
                sVar6 = (short)((uint)uVar38 >> 0x10);
                sVar7 = (short)((uint6)uVar39 >> 0x20);
                sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar40[0xe] -
                                         (0xff < sVar8),CONCAT16(cVar5,uVar39)) >> 0x30);
                *(uint *)(puVar17 + lVar18) =
                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 -
                                                (0xff < sVar6),
                                                (0 < sVar37) * (sVar37 < 0x100) * cVar2 -
                                                (0xff < sVar37))));
                lVar18 = lVar18 + 4;
              } while (lVar18 != 0x10);
            }
            lVar21 = lVar21 + 1;
            puVar17 = puVar17 + 0x10;
            pfVar15 = pfVar15 + 0x10;
          } while (lVar21 != 0x10);
          uVar16 = 0;
          bVar9 = true;
          do {
            bVar10 = bVar9;
            lVar12 = -0x20;
            do {
              auVar33 = psllw(*(undefined1 (*) [16])(auStack_f8 + lVar12 + uVar16),2);
              auVar40 = psllw(*(undefined1 (*) [16])(local_d8 + lVar12 + uVar16),4);
              auVar36 = psllw(*(undefined1 (*) [16])(auStack_b8 + lVar12 + uVar16),6);
              *(undefined1 (*) [16])((long)pvVar19 + lVar12 + (uVar16 >> 2) + 0x30) =
                   auVar36 & auVar32 | auVar40 & auVar27 |
                   auVar33 & auVar34 | *(undefined1 (*) [16])(auStack_118 + lVar12 + uVar16);
              lVar12 = lVar12 + 0x10;
            } while (lVar12 != 0);
            uVar16 = 0x80;
            bVar9 = false;
          } while (bVar10);
          pfVar22 = pfVar22 + 0x100;
          uVar20 = uVar20 + 1;
          pfVar14 = pfVar14 + 0x100;
          pvVar19 = (void *)((long)pvVar19 + 0x54);
        } while (uVar20 != ((uint)((ulong)n_per_row >> 8) & 0x7fffff));
      }
      src = src + n_per_row;
      dst = (void *)((long)dst + sVar11);
      lVar13 = lVar13 + 1;
    } while (lVar13 != nrow);
  }
  return sVar11 * nrow;
}

Assistant:

size_t quantize_q2_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q2_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q2_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q2_K_impl(src, (block_q2_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}